

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

MemoryAccessMask __thiscall
spv::Builder::sanitizeMemoryAccessForStorageClass
          (Builder *this,MemoryAccessMask memoryAccess,StorageClass sc)

{
  if (((StorageBuffer < sc) || ((0x1014U >> (sc & 0x1f) & 1) == 0)) && (sc != PhysicalStorageBuffer)
     ) {
    return memoryAccess &
           ~(MemoryAccessNonPrivatePointerKHRMask|MakePointerVisible|MakePointerAvailable);
  }
  return memoryAccess;
}

Assistant:

spv::MemoryAccessMask Builder::sanitizeMemoryAccessForStorageClass(spv::MemoryAccessMask memoryAccess, StorageClass sc)
    const
{
    switch (sc) {
    case spv::StorageClassUniform:
    case spv::StorageClassWorkgroup:
    case spv::StorageClassStorageBuffer:
    case spv::StorageClassPhysicalStorageBufferEXT:
        break;
    default:
        memoryAccess = spv::MemoryAccessMask(memoryAccess &
                        ~(spv::MemoryAccessMakePointerAvailableKHRMask |
                          spv::MemoryAccessMakePointerVisibleKHRMask |
                          spv::MemoryAccessNonPrivatePointerKHRMask));
        break;
    }
    return memoryAccess;
}